

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O2

JSONValue * JSON::Parse(wchar_t *data)

{
  bool bVar1;
  JSONValue *this;
  wchar_t *local_10;
  
  bVar1 = SkipWhitespace(&local_10);
  if ((bVar1) && (this = JSONValue::Parse(&local_10), this != (JSONValue *)0x0)) {
    bVar1 = SkipWhitespace(&local_10);
    if (!bVar1) {
      return this;
    }
    JSONValue::~JSONValue(this);
    operator_delete(this);
  }
  return (JSONValue *)0x0;
}

Assistant:

JSONValue *JSON::Parse(const wchar_t *data)
{
	// Skip any preceding whitespace, end of data = no JSON = fail
	if (!SkipWhitespace(&data))
		return NULL;

	// We need the start of a value here now...
	JSONValue *value = JSONValue::Parse(&data);
	if (value == NULL)
		return NULL;
	
	// Can be white space now and should be at the end of the string then...
	if (SkipWhitespace(&data))
	{
		delete value;
		return NULL;
	}
	
	// We're now at the end of the string
	return value;
}